

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Log::Log(Log *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"log","");
  (this->super_LogFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d23db0;
  (this->super_LogFunc).super_CFloatFunc1.m_name._M_dataplus._M_p =
       (pointer)&(this->super_LogFunc).super_CFloatFunc1.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_LogFunc).super_CFloatFunc1.m_name,local_38,
             local_30 + (long)local_38);
  (this->super_LogFunc).super_CFloatFunc1.m_func = deLog;
  (this->super_LogFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d23fa8;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_LogFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00d24038;
  return;
}

Assistant:

Log2	(void) : LogFunc("log2", deLog2) {}